

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool ParseList(TidyDocImpl *doc,TidyOptionImpl *option)

{
  TidyConfigChangeCallback p_Var1;
  StreamIn *pSVar2;
  ctmbstr s1;
  uint c;
  uint uVar3;
  Bool BVar4;
  int iVar5;
  tmbstr s2;
  ulong uVar6;
  TidyOption opt;
  ulong uVar7;
  int iVar8;
  TidyDoc tdoc;
  bool bVar9;
  tmbchar buf [1024];
  tmbchar local_438 [1032];
  
  p_Var1 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if (p_Var1 == (TidyConfigChangeCallback)0x0) {
    s2 = (ctmbstr)0x0;
  }
  else {
    s2 = prvTidytmbstrdup(doc->allocator,(doc->config).value[option->id].p);
  }
  iVar8 = 0;
  SetOptionValue(doc,option->id,(ctmbstr)0x0);
  if ((doc->config).c == 0xffffffff) {
    BVar4 = yes;
  }
  else {
    c = SkipWhite(&doc->config);
    do {
      if ((c < 0x2d) && ((0x100100000200U >> ((ulong)c & 0x3f) & 1) != 0)) {
        if ((doc->config).c != 0xffffffff) {
          pSVar2 = (doc->config).cfgIn;
          if (pSVar2 == (StreamIn *)0x0) {
            uVar3 = 0xffffffff;
          }
          else {
            uVar3 = prvTidyReadChar(pSVar2);
          }
          (doc->config).c = uVar3;
        }
        c = (doc->config).c;
      }
      else {
        if ((c == 0xd) || (c == 10)) {
          if ((doc->config).c != 0xffffffff) {
            pSVar2 = (doc->config).cfgIn;
            if (pSVar2 == (StreamIn *)0x0) {
              uVar3 = 0xffffffff;
            }
            else {
              uVar3 = prvTidyReadChar(pSVar2);
            }
            (doc->config).c = uVar3;
          }
          uVar3 = (doc->config).c;
          bVar9 = c == 0xd;
          c = uVar3;
          if (uVar3 == 10 && bVar9) {
            pSVar2 = (doc->config).cfgIn;
            if (pSVar2 == (StreamIn *)0x0) {
              c = 0xffffffff;
            }
            else {
              c = prvTidyReadChar(pSVar2);
            }
            (doc->config).c = c;
          }
          BVar4 = prvTidyIsWhite(c);
          if (BVar4 == no) {
            local_438[0] = '\0';
            prvTidyUngetChar(c,(doc->config).cfgIn);
            prvTidyUngetChar(10,(doc->config).cfgIn);
            break;
          }
        }
        if (c == 0xffffffff) {
          bVar9 = true;
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          while ((BVar4 = prvTidyIsWhite(c), BVar4 == no && (c != 0x2c))) {
            local_438[uVar7] = (tmbchar)c;
            if ((doc->config).c != 0xffffffff) {
              pSVar2 = (doc->config).cfgIn;
              if (pSVar2 == (StreamIn *)0x0) {
                uVar3 = 0xffffffff;
              }
              else {
                uVar3 = prvTidyReadChar(pSVar2);
              }
              (doc->config).c = uVar3;
            }
            c = (doc->config).c;
            uVar6 = uVar7 + 1;
            iVar5 = 1;
            if ((0x3fc < uVar7) || (uVar7 = uVar6, c == 0xffffffff)) goto LAB_0014f283;
          }
          iVar5 = (int)uVar7;
          uVar6 = uVar7;
LAB_0014f283:
          bVar9 = iVar5 == 0;
        }
        local_438[uVar6] = '\0';
        if (!bVar9) {
          prvTidyDeclareListItem(doc,option,local_438);
          iVar8 = iVar8 + 1;
        }
      }
    } while (c != 0xffffffff);
    if (p_Var1 != (TidyConfigChangeCallback)0x0) {
      s1 = (doc->config).value[option->id].p;
      if (s1 == s2) {
        bVar9 = true;
      }
      else if (s2 == (ctmbstr)0x0 || s1 == (ctmbstr)0x0) {
        bVar9 = false;
      }
      else {
        iVar5 = prvTidytmbstrcmp(s1,s2);
        bVar9 = iVar5 == 0;
      }
      doc->pConfigChangeCallback = p_Var1;
      if (s2 != (ctmbstr)0x0) {
        (*doc->allocator->vtbl->free)(doc->allocator,s2);
      }
      if ((!bVar9) && (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0)) {
        (*doc->pConfigChangeCallback)((TidyDoc)doc,(TidyOption)option);
      }
    }
    BVar4 = (Bool)(iVar8 != 0);
  }
  return BVar4;
}

Assistant:

Bool ParseList( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[1024];
    uint i = 0, nItems = 0;
    uint c;
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    tmbstr oldbuff = NULL;

    /* Handle comparing before and after for the config change callback.
       We have do handle this manually, because otherwise TY_(DeclareListItem)
       would fire a callback for EVERY list item being added. */
    doc->pConfigChangeCallback = NULL;
    if ( callback )
    {
        TidyOptionValue* oldval = &(doc->config.value[ option->id ]);
        oldbuff = TY_(tmbstrdup)( doc->allocator, oldval->p );
    }

    SetOptionValue( doc, option->id, NULL );

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
        return yes;

    c = SkipWhite( cfg );

    do
    {
        if (c == ' ' || c == '\t' || c == ',')
        {
            c = AdvanceChar( cfg );
            continue;
        }

        if ( c == '\r' || c == '\n' )
        {
            uint c2 = AdvanceChar( cfg );
            if ( c == '\r' && c2 == '\n' )
                c = AdvanceChar( cfg );
            else
                c = c2;

            if ( !TY_(IsWhite)(c) )
            {
                buf[i] = 0;
                TY_(UngetChar)( c, cfg->cfgIn );
                TY_(UngetChar)( '\n', cfg->cfgIn );
                break;
            }
        }

        while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) && c != ',' )
        {
            buf[i++] = (tmbchar) c;
            c = AdvanceChar( cfg );
        }

        buf[i] = '\0';
        if (i == 0)          /* Skip empty attribute definition. Possible when */
            continue;        /* there is a trailing space on the line. */

        /* add attribute to array */
        TY_(DeclareListItem)( doc, option, buf );

        i = 0;
        ++nItems;
    }
    while ( c != EndOfStream );

    if ( i > 0 )
        TY_(DeclareListItem)( doc, option, buf );

    /* If there's a callback, compare the old and new values, and fire
       the callback appropriately. */
    if ( callback )
    {
        TidyOptionValue* val = &(doc->config.value[ option->id ]);
        Bool fire_callback = OptionChangedValuesDiffer( val->p, oldbuff);

        doc->pConfigChangeCallback = callback;

        if ( oldbuff )
            TidyFree( doc->allocator, oldbuff );

        if ( fire_callback )
            PerformOptionChangedCallback( doc, option );
    }

    return ( nItems > 0 );
}